

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O0

int32_t ll_rssi_scan_get(uint8_t *buf,uint16_t len,uint8_t *bytes_received)

{
  int32_t local_30;
  int32_t rw_response;
  uint8_t *bytes_received_local;
  uint16_t len_local;
  uint8_t *buf_local;
  
  if (((buf == (uint8_t *)0x0) || (len == 0)) || (bytes_received == (uint8_t *)0x0)) {
    buf_local._4_4_ = -0x65;
  }
  else {
    local_30 = hal_read_write(OP_RSSI_GET,(uint8_t *)0x0,0,buf,len);
    if (local_30 < 0) {
      *bytes_received = '\0';
      buf_local._4_4_ = local_30;
    }
    else {
      *bytes_received = (uint8_t)local_30;
      if (-1 < local_30) {
        local_30 = 0;
      }
      buf_local._4_4_ = local_30;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int32_t ll_rssi_scan_get(uint8_t buf[], uint16_t len, uint8_t *bytes_received)
{
    int32_t rw_response;

    if (buf == NULL || len <= 0 || bytes_received == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    rw_response = hal_read_write(OP_RSSI_GET, NULL, 0, buf, len);

    if (rw_response < 0)
    {
        *bytes_received = 0;
        return rw_response;
    }

    *bytes_received = (uint8_t) (rw_response & 0xFF);
    return (rw_response >= 0) ? LL_IFC_ACK : rw_response;
}